

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void * __thiscall tetgenmesh::arraypool::lookup(arraypool *this,int objectindex)

{
  char *pcVar1;
  int iVar2;
  
  if (((this->toparray != (char **)0x0) &&
      (iVar2 = objectindex >> ((byte)this->log2objectsperblock & 0x1f), iVar2 < this->toparraylen))
     && (pcVar1 = this->toparray[iVar2], pcVar1 != (char *)0x0)) {
    return pcVar1 + (long)this->objectbytes * ((long)objectindex & (long)this->objectsperblock - 1U)
    ;
  }
  return (void *)0x0;
}

Assistant:

void* tetgenmesh::arraypool::lookup(int objectindex)
{
  char *block;
  int topindex;

  // Has the top array been allocated yet?
  if (toparray == (char **) NULL) {
    return (void *) NULL;
  }

  // Compute the index in the top array (upper bits).
  topindex = objectindex >> log2objectsperblock;
  // Does the top index fit in the top array?
  if (topindex >= toparraylen) {
    return (void *) NULL;
  }

  // Find the block, or learn that it hasn't been allocated yet.
  block = toparray[topindex];
  if (block == (char *) NULL) {
    return (void *) NULL;
  }

  // Compute a pointer to the object with the given index.  Note that
  //   'objectsperblock' is a power of two, so the & operation is a bit mask
  //   that preserves the lower bits.
  return (void *)(block + (objectindex & (objectsperblock - 1)) * objectbytes);
}